

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O2

int * __thiscall despot::Grid<int>::operator()(Grid<int> *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  Coord aCStack_28 [8];
  
  despot::Coord::Coord(aCStack_28,x,y);
  bVar1 = Inside(this,aCStack_28);
  if (bVar1) {
    iVar2 = Index(this,x,y);
    return (this->grid_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar2;
  }
  __assert_fail("Inside(Coord(x, y))",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/grid.h"
                ,0x3b,"const T &despot::Grid<int>::operator()(int, int) const [T = int]");
}

Assistant:

const T& operator()(int x, int y) const {
		assert(Inside(Coord(x, y)));
		return grid_[Index(x, y)];
	}